

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportconsole.cpp
# Opt level: O0

void __thiscall trun::ResultsReportConsole::PrintReport(ResultsReportConsole *this)

{
  ResultSummary *pRVar1;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *pvVar2;
  Config *pCVar3;
  ResultsReportConsole *this_local;
  
  PrintSummary(this);
  pRVar1 = ResultSummary::Instance();
  pvVar2 = ResultSummary::Results(pRVar1);
  PrintFailures(this,pvVar2);
  pCVar3 = Config::Instance();
  if ((pCVar3->printPassSummary & 1U) != 0) {
    pRVar1 = ResultSummary::Instance();
    pvVar2 = ResultSummary::Results(pRVar1);
    PrintPasses(this,pvVar2);
  }
  return;
}

Assistant:

void ResultsReportConsole::PrintReport() {
    PrintSummary();
    PrintFailures(ResultSummary::Instance().Results());
    if (Config::Instance().printPassSummary) {
        PrintPasses(ResultSummary::Instance().Results());
    }
}